

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O3

HighsDebugStatus debugNonbasicFlagConsistent(HighsOptions *options,HighsLp *lp,SimplexBasis *basis)

{
  HighsDebugStatus HVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (0 < (options->super_HighsOptionsStruct).highs_debug_level) {
    uVar4 = lp->num_row_ + lp->num_col_;
    uVar2 = 0;
    HVar1 = kOk;
    if (uVar4 != *(int *)&(basis->nonbasicFlag_).
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(basis->nonbasicFlag_).
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                  "nonbasicFlag size error\n");
      HVar1 = kLogicalError;
    }
    if (0 < (int)uVar4) {
      uVar3 = 0;
      uVar2 = 0;
      do {
        uVar2 = uVar2 + ((basis->nonbasicFlag_).
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar3] == '\0');
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    if (uVar2 != lp->num_row_) {
      highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                  "nonbasicFlag has %d, not %d basic variables\n",(ulong)uVar2);
      HVar1 = kLogicalError;
    }
    return HVar1;
  }
  return kNotChecked;
}

Assistant:

HighsDebugStatus debugNonbasicFlagConsistent(const HighsOptions& options,
                                             const HighsLp& lp,
                                             const SimplexBasis& basis) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  HighsInt numTot = lp.num_col_ + lp.num_row_;
  const bool right_size = (HighsInt)basis.nonbasicFlag_.size() == numTot;
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  HighsInt num_basic_variables = 0;
  for (HighsInt var = 0; var < numTot; var++) {
    if (basis.nonbasicFlag_[var] == kNonbasicFlagFalse) {
      num_basic_variables++;
    } else {
      assert(basis.nonbasicFlag_[var] == kNonbasicFlagTrue);
    }
  }
  bool right_num_basic_variables = num_basic_variables == lp.num_row_;
  if (!right_num_basic_variables) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag has %" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT
                " basic variables\n",
                num_basic_variables, lp.num_row_);
    assert(right_num_basic_variables);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}